

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  lys_feature *plVar1;
  char **__ptr;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  lys_submodule *plVar7;
  uint uVar8;
  
  if (module == (lys_module *)0x0) {
LAB_00163686:
    __ptr = (char **)0x0;
  }
  else {
    uVar8 = (uint)module->features_size;
    if (module->inc_size != 0) {
      lVar5 = 0;
      do {
        uVar8 = uVar8 + *(byte *)(*(long *)(module->inc->rev + lVar5 + -8) + 0x4c);
        lVar5 = lVar5 + 0x30;
      } while ((ulong)module->inc_size * 0x30 != lVar5);
    }
    __ptr = (char **)malloc((ulong)(uVar8 + 1) * 8);
    if (__ptr == (char **)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
      return (char **)0x0;
    }
    if (states != (uint8_t **)0x0) {
      puVar2 = (uint8_t *)malloc((ulong)(uVar8 + 1));
      *states = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
        free(__ptr);
        goto LAB_00163686;
      }
    }
    if (module->features_size == '\0') {
      uVar3 = 0;
    }
    else {
      lVar5 = 0;
      uVar3 = 0;
      do {
        plVar1 = module->features;
        __ptr[uVar3] = *(char **)(plVar1->padding + lVar5 + -0x1c);
        if (states != (uint8_t **)0x0) {
          (*states)[uVar3] = plVar1->padding[lVar5 + -3] & 1;
        }
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar3 < module->features_size);
    }
    uVar8 = (uint)uVar3;
    if (module->inc_size != '\0') {
      uVar4 = 0;
      do {
        plVar7 = module->inc[uVar4].submodule;
        if (plVar7->features_size != '\0') {
          lVar5 = 0;
          uVar6 = 0;
          do {
            uVar8 = (int)uVar3 + (int)uVar6;
            plVar1 = plVar7->features;
            __ptr[uVar8] = *(char **)(plVar1->padding + lVar5 + -0x1c);
            if (states != (uint8_t **)0x0) {
              (*states)[uVar8] = plVar1->padding[lVar5 + -3] & 1;
            }
            uVar6 = uVar6 + 1;
            plVar7 = module->inc[uVar4].submodule;
            lVar5 = lVar5 + 0x40;
          } while (uVar6 < plVar7->features_size);
          uVar3 = (ulong)(uint)((int)uVar3 + (int)uVar6);
        }
        uVar8 = (uint)uVar3;
        uVar4 = uVar4 + 1;
      } while (uVar4 < module->inc_size);
    }
    __ptr[uVar8] = (char *)0x0;
  }
  return __ptr;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(module->ctx), NULL);

    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        LY_CHECK_ERR_RETURN(!(*states), LOGMEM(module->ctx); free(result), NULL);
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}